

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall
IRBuilder::BuildReg2U
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot R0,RegSlot R1,uint index)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined4 extraout_var;
  AddrOpnd *opndProtoParent;
  undefined4 extraout_var_00;
  AddrOpnd *opndConstructorParent;
  Opnd *opndEnvironment;
  
  bVar2 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x8ac,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar2) goto LAB_004d2739;
    *puVar4 = 0;
  }
  if (newOpcode == InitBaseClass) {
    iVar3 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x19])();
    opndProtoParent =
         IR::AddrOpnd::New(CONCAT44(extraout_var,iVar3),AddrOpndKindDynamicVar,this->m_func,true,
                           (Var)0x0);
    iVar3 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x1a])();
    opndConstructorParent =
         IR::AddrOpnd::New(CONCAT44(extraout_var_00,iVar3),AddrOpndKindDynamicVar,this->m_func,true,
                           (Var)0x0);
    opndEnvironment = GetEnvironmentOperand(this,offset);
    BuildInitClass(this,offset,R0,R1,&opndProtoParent->super_Opnd,&opndConstructorParent->super_Opnd
                   ,opndEnvironment,index);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x8b9,"(false)","Unknown Reg2U op");
    if (!bVar2) {
LAB_004d2739:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void
IRBuilder::BuildReg2U(Js::OpCode newOpcode, uint32 offset, Js::RegSlot R0, Js::RegSlot R1, uint index)
{
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));

    switch (newOpcode)
    {
        case Js::OpCode::InitBaseClass:
        {
            IR::Opnd * opndProtoParent = IR::AddrOpnd::New(m_func->GetScriptContextInfo()->GetObjectPrototypeAddr(), IR::AddrOpndKindDynamicVar, m_func, true);
            IR::Opnd * opndCtorParent = IR::AddrOpnd::New(m_func->GetScriptContextInfo()->GetFunctionPrototypeAddr(), IR::AddrOpndKindDynamicVar, m_func, true);
            BuildInitClass(offset, R0, R1, opndProtoParent, opndCtorParent, GetEnvironmentOperand(offset), index);
            break;
        }

        default:
            AssertMsg(false, "Unknown Reg2U op");
            break;
    }
}